

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_wbuf.c
# Opt level: O2

void lj_wbuf_addn(lj_wbuf *buf,void *src,size_t n)

{
  uint8_t *__dest;
  uint8_t *puVar1;
  
  if ((buf->flags & 2) == 0) {
    while( true ) {
      puVar1 = (uint8_t *)buf->size;
      __dest = buf->pos;
      if (n <= puVar1) break;
      puVar1 = puVar1 + ((long)buf->buf - (long)__dest);
      memcpy(__dest,src,(size_t)puVar1);
      buf->pos = buf->pos + (long)puVar1;
      lj_wbuf_flush(buf);
      src = (void *)((long)src + (long)puVar1);
      n = n + -(long)puVar1;
    }
    if (buf->buf + ((long)puVar1 - (long)__dest) < n) {
      lj_wbuf_flush(buf);
      __dest = buf->pos;
    }
    memcpy(__dest,src,n);
    buf->pos = buf->pos + n;
  }
  return;
}

Assistant:

void lj_wbuf_addn(struct lj_wbuf *buf, const void *src, size_t n)
{
  if (LJ_UNLIKELY(lj_wbuf_test_flag(buf, STREAM_STOP)))
    return;
  /*
  ** Very unlikely: We are told to write a large buffer at once.
  ** Buffer doesn't belong to us so we must to pump data
  ** through the buffer.
  */
  while (LJ_UNLIKELY(n > buf->size)) {
    const size_t left = wbuf_left(buf);
    memcpy(buf->pos, src, left);
    buf->pos += (ptrdiff_t)left;
    lj_wbuf_flush(buf);
    src = (uint8_t *)src + (ptrdiff_t)left;
    n -= left;
  }

  wbuf_reserve(buf, n);
  memcpy(buf->pos, src, n);
  buf->pos += (ptrdiff_t)n;
}